

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall Json::Value::removeMember(Value *this,char *key)

{
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  size_t sVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  pVar2;
  CZString actualKey;
  String SStack_1a8;
  key_type local_188 [23];
  
  if (*(char *)&this->bits_ != '\0') {
    if (*(char *)&this->bits_ != '\a') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_188,"in Json::Value::removeMember(): requires objectValue",0x34);
      std::__cxx11::stringbuf::str();
      throwLogicError(&SStack_1a8);
    }
    sVar1 = strlen(key);
    local_188[0].field_1.index_ = (int)sVar1 << 2;
    this_00 = &((this->value_).map_)->_M_t;
    local_188[0].cstr_ = key;
    pVar2 = std::
            _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::equal_range(this_00,local_188);
    std::
    _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::_M_erase_aux(this_00,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
    if ((local_188[0].cstr_ != (char *)0x0) && ((local_188[0].field_1.index_ & 3) == 1)) {
      free(local_188[0].cstr_);
    }
  }
  return;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}